

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O1

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  jpeg_entropy_decoder *pjVar4;
  int *piVar5;
  JBLOCKROW paJVar6;
  jpeg_error_mgr *pjVar7;
  bool bVar8;
  short sVar9;
  short sVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var16;
  
  pjVar4 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar4[4].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    piVar5 = (int *)((long)&pjVar4[4].start_pass + 4);
    *piVar5 = *piVar5 + -1;
  }
  if (*(int *)&pjVar4[2].start_pass != -1) {
    bVar2 = (byte)cinfo->Al;
    piVar5 = cinfo->natural_order;
    paJVar6 = *MCU_data;
    uVar14 = cinfo->Se;
    if (0 < (int)uVar14) {
      do {
        if ((*paJVar6)[piVar5[uVar14]] != 0) goto LAB_00114108;
        bVar8 = 1 < (int)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar8);
      uVar14 = 0;
    }
LAB_00114108:
    iVar15 = cinfo->Ss;
    if (iVar15 <= cinfo->Se) {
      iVar3 = cinfo->cur_comp_info[0]->ac_tbl_no;
      do {
        p_Var16 = (&pjVar4[0xc].decode_mcu)[iVar3];
        lVar13 = (long)(iVar15 * 3 + -3);
        if (((int)uVar14 < iVar15) &&
           (iVar11 = arith_decode(cinfo,(uchar *)(p_Var16 + lVar13)), iVar11 != 0)) {
          return 1;
        }
        p_Var16 = p_Var16 + lVar13 + 2;
        lVar13 = 0;
        while( true ) {
          iVar11 = piVar5[iVar15 + lVar13];
          sVar10 = (short)(1 << (bVar2 & 0x1f));
          sVar9 = (short)(-1 << (bVar2 & 0x1f));
          if ((*paJVar6)[iVar11] != 0) break;
          iVar12 = arith_decode(cinfo,(uchar *)(p_Var16 + -1));
          if (iVar12 != 0) {
            iVar12 = arith_decode(cinfo,(uchar *)&pjVar4[0x14].decode_mcu);
            if (iVar12 != 0) {
              sVar10 = sVar9;
            }
            (*paJVar6)[iVar11] = sVar10;
            goto LAB_0011425e;
          }
          lVar1 = iVar15 + lVar13;
          lVar13 = lVar13 + 1;
          p_Var16 = p_Var16 + 3;
          if (cinfo->Se <= lVar1) {
            pjVar7 = cinfo->err;
            pjVar7->msg_code = 0x75;
            (*pjVar7->emit_message)((j_common_ptr)cinfo,-1);
            *(undefined4 *)&pjVar4[2].start_pass = 0xffffffff;
            return 1;
          }
        }
        iVar12 = arith_decode(cinfo,(uchar *)p_Var16);
        if (iVar12 != 0) {
          if (-1 < (*paJVar6)[iVar11]) {
            sVar9 = sVar10;
          }
          (*paJVar6)[iVar11] = (*paJVar6)[iVar11] + sVar9;
        }
LAB_0011425e:
        iVar11 = iVar15 + (int)lVar13;
        iVar15 = iVar15 + (int)lVar13 + 1;
      } while (iVar11 < cinfo->Se);
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{   
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int s, k, r;
  unsigned int EOBRUN;
  int Se, p1, m1;
  const int * natural_order;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  BITREAD_STATE_VARS;
  d_derived_tbl * tbl;
  int num_newnz;
  int newnz_pos[DCTSIZE2];

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, don't modify the MCU.
   */
  if (! entropy->insufficient_data) {

    Se = cinfo->Se;
    p1 = 1 << cinfo->Al;	/* 1 in the bit position being coded */
    m1 = (-1) << cinfo->Al;	/* -1 in the bit position being coded */
    natural_order = cinfo->natural_order;

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
    EOBRUN = entropy->saved.EOBRUN; /* only part of saved state we need */

    /* There is always only one block per MCU */
    block = MCU_data[0];
    tbl = entropy->ac_derived_tbl;

    /* If we are forced to suspend, we must undo the assignments to any newly
     * nonzero coefficients in the block, because otherwise we'd get confused
     * next time about which coefficients were already nonzero.
     * But we need not undo addition of bits to already-nonzero coefficients;
     * instead, we can test the current bit to see if we already did it.
     */
    num_newnz = 0;

    /* initialize coefficient loop counter to start of band */
    k = cinfo->Ss;

    if (EOBRUN == 0) {
      for (; k <= Se; k++) {
	HUFF_DECODE(s, br_state, tbl, goto undoit, label3);
	r = s >> 4;
	s &= 15;
	if (s) {
	  if (s != 1)		/* size of new coef should always be 1 */
	    WARNMS(cinfo, JWRN_HUFF_BAD_CODE);
	  CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	  if (GET_BITS(1))
	    s = p1;		/* newly nonzero coef is positive */
	  else
	    s = m1;		/* newly nonzero coef is negative */
	} else {
	  if (r != 15) {
	    EOBRUN = 1 << r;	/* EOBr, run length is 2^r + appended bits */
	    if (r) {
	      CHECK_BIT_BUFFER(br_state, r, goto undoit);
	      r = GET_BITS(r);
	      EOBRUN += r;
	    }
	    break;		/* rest of block is handled by EOB logic */
	  }
	  /* note s = 0 for processing ZRL */
	}
	/* Advance over already-nonzero coefs and r still-zero coefs,
	 * appending correction bits to the nonzeroes.  A correction bit is 1
	 * if the absolute value of the coefficient must be increased.
	 */
	do {
	  thiscoef = *block + natural_order[k];
	  if (*thiscoef != 0) {
	    CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	    if (GET_BITS(1)) {
	      if ((*thiscoef & p1) == 0) { /* do nothing if already set it */
		if (*thiscoef >= 0)
		  *thiscoef += p1;
		else
		  *thiscoef += m1;
	      }
	    }
	  } else {
	    if (--r < 0)
	      break;		/* reached target zero coefficient */
	  }
	  k++;
	} while (k <= Se);
	if (s) {
	  int pos = natural_order[k];
	  /* Output newly nonzero coefficient */
	  (*block)[pos] = (JCOEF) s;
	  /* Remember its position in case we have to suspend */
	  newnz_pos[num_newnz++] = pos;
	}
      }
    }

    if (EOBRUN > 0) {
      /* Scan any remaining coefficient positions after the end-of-band
       * (the last newly nonzero coefficient, if any).  Append a correction
       * bit to each already-nonzero coefficient.  A correction bit is 1
       * if the absolute value of the coefficient must be increased.
       */
      for (; k <= Se; k++) {
	thiscoef = *block + natural_order[k];
	if (*thiscoef != 0) {
	  CHECK_BIT_BUFFER(br_state, 1, goto undoit);
	  if (GET_BITS(1)) {
	    if ((*thiscoef & p1) == 0) { /* do nothing if already changed it */
	      if (*thiscoef >= 0)
		*thiscoef += p1;
	      else
		*thiscoef += m1;
	    }
	  }
	}
      }
      /* Count one block completed in EOB run */
      EOBRUN--;
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    entropy->saved.EOBRUN = EOBRUN; /* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;

undoit:
  /* Re-zero any output coefficients that we made newly nonzero */
  while (num_newnz > 0)
    (*block)[newnz_pos[--num_newnz]] = 0;

  return FALSE;
}